

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::
Maybe<kj::_::Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>_>
::Maybe(Maybe<kj::_::Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>_>
        *this,Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>
              *t)

{
  (this->ptr).isSet = true;
  (this->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Array<char>_>.value.ptr =
       (t->impl).super_TupleElement<0U,_kj::Array<char>_>.value.ptr;
  (this->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Array<char>_>.value.size_ =
       (t->impl).super_TupleElement<0U,_kj::Array<char>_>.value.size_;
  (this->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Array<char>_>.value.disposer =
       (t->impl).super_TupleElement<0U,_kj::Array<char>_>.value.disposer;
  (t->impl).super_TupleElement<0U,_kj::Array<char>_>.value.ptr = (char *)0x0;
  (t->impl).super_TupleElement<0U,_kj::Array<char>_>.value.size_ = 0;
  Maybe<kj::Array<char>_>::Maybe
            (&(this->ptr).field_1.value.impl.super_TupleElement<1U,_kj::Maybe<kj::Array<char>_>_>.
              value,&(t->impl).super_TupleElement<1U,_kj::Maybe<kj::Array<char>_>_>.value);
  Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>::Maybe
            (&(this->ptr).field_1.value.impl.
              super_TupleElement<2U,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>.
              value,&(t->impl).
                     super_TupleElement<2U,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>
                     .value);
  return;
}

Assistant:

Maybe(T&& t): ptr(kj::mv(t)) {}